

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingManager.cpp
# Opt level: O2

AbstractLoggingDevice * __thiscall
SLogLib::LoggingManager::QueryDevice(LoggingManager *this,string *deviceName)

{
  LoggingManagerPriv *pLVar1;
  __type _Var2;
  mutex *__mutex;
  AbstractLoggingDevice *this_00;
  LoggingManagerPriv *pLVar3;
  string local_50;
  
  __mutex = &this->mPriv->mLoggingDevicesMutex;
  std::mutex::lock(__mutex);
  pLVar1 = this->mPriv;
  pLVar3 = pLVar1;
  do {
    do {
      pLVar3 = (LoggingManagerPriv *)
               (pLVar3->mLoggingDevices).
               super__List_base<SLogLib::AbstractLoggingDevice_*,_std::allocator<SLogLib::AbstractLoggingDevice_*>_>
               ._M_impl._M_node.super__List_node_base._M_next;
      if (pLVar3 == pLVar1) {
        this_00 = (AbstractLoggingDevice *)0x0;
        goto LAB_00106f03;
      }
      this_00 = (AbstractLoggingDevice *)
                (pLVar3->mLoggingDevices).
                super__List_base<SLogLib::AbstractLoggingDevice_*,_std::allocator<SLogLib::AbstractLoggingDevice_*>_>
                ._M_impl._M_node._M_size;
    } while (this_00 == (AbstractLoggingDevice *)0x0);
    AbstractLoggingDevice::Name_abi_cxx11_(&local_50,this_00);
    _Var2 = std::operator==(deviceName,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  } while (!_Var2);
LAB_00106f03:
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return this_00;
}

Assistant:

AbstractLoggingDevice* LoggingManager::QueryDevice(const std::string& deviceName)
{
	// Lock must be here because another thread can add/remove 
	// a new device while the for loop is running.
	std::lock_guard<std::mutex> _lock(mPriv->mLoggingDevicesMutex);
	
	for(AbstractLoggingDevice* _device : mPriv->mLoggingDevices)
	{
		if(_device && deviceName == _device->Name())
		{
			return _device;
		}
	}
	return nullptr;
}